

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts5VocabNextMethod(sqlite3_vtab_cursor *pCursor)

{
  sqlite3_module *psVar1;
  long *plVar2;
  long lVar3;
  int iVar4;
  bool bVar5;
  int local_70;
  int local_68;
  int ii;
  int iCol;
  int iOff;
  i64 iPos;
  u8 *puStack_50;
  int nPos;
  u8 *pPos;
  int eDetail;
  int bCmp;
  int nCmp;
  int nTerm;
  char *zTerm;
  int nCol;
  int rc;
  Fts5VocabTable *pTab;
  Fts5VocabCursor *pCsr;
  sqlite3_vtab_cursor *pCursor_local;
  
  _nCol = pCursor->pVtab;
  zTerm._4_4_ = 0;
  zTerm._0_4_ = *(int *)&(pCursor[2].pVtab[1].pModule)->xBestIndex;
  pCursor[10].pVtab = (sqlite3_vtab *)((long)&(pCursor[10].pVtab)->pModule + 1);
  pTab = (Fts5VocabTable *)pCursor;
  pCsr = (Fts5VocabCursor *)pCursor;
  if (_nCol[2].nRef == 2) {
    pCursor_local._4_4_ = fts5VocabInstanceNext((Fts5VocabCursor *)pCursor);
  }
  else {
    if (_nCol[2].nRef == 0) {
      *(int *)&pCursor[7].pVtab = *(int *)&pCursor[7].pVtab + 1;
      while ((*(int *)&pCursor[7].pVtab < (int)zTerm &&
             ((&(pCursor[9].pVtab)->pModule)[*(int *)&pCursor[7].pVtab] == (sqlite3_module *)0x0)))
      {
        *(int *)&pCursor[7].pVtab = *(int *)&pCursor[7].pVtab + 1;
      }
    }
    if ((_nCol[2].nRef != 0) || ((int)zTerm <= *(int *)&pCursor[7].pVtab)) {
      if (*(char *)((long)&(pCursor[4].pVtab)->zErrMsg + 4) == '\0') {
        _nCmp = (u8 *)sqlite3Fts5IterTerm((Fts5IndexIter *)pCursor[4].pVtab,&bCmp);
        if (-1 < *(int *)&pTab->db) {
          if (bCmp < *(int *)&pTab->db) {
            local_70 = bCmp;
          }
          else {
            local_70 = *(int *)&pTab->db;
          }
          eDetail = local_70;
          pPos._4_4_ = memcmp(pTab->pGlobal,_nCmp,(long)local_70);
          if ((pPos._4_4_ < 0) || ((pPos._4_4_ == 0 && (*(int *)&pTab->db < bCmp)))) {
            *(undefined4 *)&pTab->zFts5Tbl = 1;
            return 0;
          }
        }
        sqlite3Fts5BufferSet((int *)((long)&zTerm + 4),(Fts5Buffer *)&pTab[1].zFts5Tbl,bCmp,_nCmp);
        memset(pTab[1].base.pModule,0,(long)(int)zTerm << 3);
        memset(*(void **)&pTab[1].base.nRef,0,(long)(int)zTerm << 3);
        pTab->eType = 0;
        while (zTerm._4_4_ == 0) {
          pPos._0_4_ = *(int *)(*(long *)((pTab->base).zErrMsg + 0x18) + 0x5c);
          _iCol = 0;
          ii = 0;
          puStack_50 = *(u8 **)(pTab->zFts5Db + 8);
          iPos._4_4_ = *(int *)(pTab->zFts5Db + 0x10);
          if (_nCol[2].nRef == 0) {
            if ((int)pPos == 0) {
              local_68 = -1;
              while (iVar4 = sqlite3Fts5PoslistNext64(puStack_50,iPos._4_4_,&ii,(i64 *)&iCol),
                    iVar4 == 0) {
                iVar4 = (int)((ulong)_iCol >> 0x20);
                if (local_68 != iVar4) {
                  if ((int)zTerm <= iVar4) {
                    zTerm._4_4_ = 0x10b;
                    break;
                  }
                  lVar3 = *(long *)&pTab[1].base.nRef;
                  *(long *)(lVar3 + (long)iVar4 * 8) = *(long *)(lVar3 + (long)iVar4 * 8) + 1;
                  local_68 = iVar4;
                }
                psVar1 = pTab[1].base.pModule;
                *(long *)(&psVar1->iVersion + (long)iVar4 * 2) =
                     *(long *)(&psVar1->iVersion + (long)iVar4 * 2) + 1;
              }
            }
            else if ((int)pPos == 2) {
              while (iVar4 = sqlite3Fts5PoslistNext64(puStack_50,iPos._4_4_,&ii,(i64 *)&iCol),
                    iVar4 == 0) {
                if ((int)zTerm <= _iCol) {
                  zTerm._4_4_ = 0x10b;
                  break;
                }
                lVar3 = *(long *)&pTab[1].base.nRef;
                *(long *)(lVar3 + _iCol * 8) = *(long *)(lVar3 + _iCol * 8) + 1;
              }
            }
            else {
              plVar2 = *(long **)&pTab[1].base.nRef;
              *plVar2 = *plVar2 + 1;
            }
          }
          else if (_nCol[2].nRef == 1) {
            if ((int)pPos == 0) {
              while (iVar4 = sqlite3Fts5PoslistNext64(puStack_50,iPos._4_4_,&ii,(i64 *)&iCol),
                    iVar4 == 0) {
                psVar1 = pTab[1].base.pModule;
                *(long *)psVar1 = *(long *)psVar1 + 1;
              }
            }
            plVar2 = *(long **)&pTab[1].base.nRef;
            *plVar2 = *plVar2 + 1;
          }
          if (zTerm._4_4_ == 0) {
            zTerm._4_4_ = sqlite3Fts5IterNextScan((Fts5IndexIter *)pTab->zFts5Db);
          }
          if ((_nCol[2].nRef == 2) ||
             ((zTerm._4_4_ == 0 &&
              ((_nCmp = (u8 *)sqlite3Fts5IterTerm((Fts5IndexIter *)pTab->zFts5Db,&bCmp),
               bCmp != *(int *)&pTab[1].zFts5Db ||
               (((0 < bCmp && (iVar4 = memcmp(_nCmp,pTab[1].zFts5Tbl,(long)bCmp), iVar4 != 0)) ||
                (pTab->zFts5Db[0x14] != '\0')))))))) break;
        }
      }
      else {
        *(undefined4 *)&pCursor[3].pVtab = 1;
      }
    }
    if (((zTerm._4_4_ == 0) && (*(int *)&pTab->zFts5Tbl == 0)) && (_nCol[2].nRef == 0)) {
      while( true ) {
        bVar5 = false;
        if (pTab->eType < (int)zTerm) {
          bVar5 = *(long *)(*(long *)&pTab[1].base.nRef + (long)pTab->eType * 8) == 0;
        }
        if (!bVar5) break;
        pTab->eType = pTab->eType + 1;
      }
      if (pTab->eType == (int)zTerm) {
        zTerm._4_4_ = 0x10b;
      }
    }
    pCursor_local._4_4_ = zTerm._4_4_;
  }
  return pCursor_local._4_4_;
}

Assistant:

static int fts5VocabNextMethod(sqlite3_vtab_cursor *pCursor){
  Fts5VocabCursor *pCsr = (Fts5VocabCursor*)pCursor;
  Fts5VocabTable *pTab = (Fts5VocabTable*)pCursor->pVtab;
  int rc = SQLITE_OK;
  int nCol = pCsr->pFts5->pConfig->nCol;

  pCsr->rowid++;

  if( pTab->eType==FTS5_VOCAB_INSTANCE ){
    return fts5VocabInstanceNext(pCsr);
  }

  if( pTab->eType==FTS5_VOCAB_COL ){
    for(pCsr->iCol++; pCsr->iCol<nCol; pCsr->iCol++){
      if( pCsr->aDoc[pCsr->iCol] ) break;
    }
  }

  if( pTab->eType!=FTS5_VOCAB_COL || pCsr->iCol>=nCol ){
    if( sqlite3Fts5IterEof(pCsr->pIter) ){
      pCsr->bEof = 1;
    }else{
      const char *zTerm;
      int nTerm;

      zTerm = sqlite3Fts5IterTerm(pCsr->pIter, &nTerm);
      assert( nTerm>=0 );
      if( pCsr->nLeTerm>=0 ){
        int nCmp = MIN(nTerm, pCsr->nLeTerm);
        int bCmp = memcmp(pCsr->zLeTerm, zTerm, nCmp);
        if( bCmp<0 || (bCmp==0 && pCsr->nLeTerm<nTerm) ){
          pCsr->bEof = 1;
          return SQLITE_OK;
        }
      }

      sqlite3Fts5BufferSet(&rc, &pCsr->term, nTerm, (const u8*)zTerm);
      memset(pCsr->aCnt, 0, nCol * sizeof(i64));
      memset(pCsr->aDoc, 0, nCol * sizeof(i64));
      pCsr->iCol = 0;

      assert( pTab->eType==FTS5_VOCAB_COL || pTab->eType==FTS5_VOCAB_ROW );
      while( rc==SQLITE_OK ){
        int eDetail = pCsr->pFts5->pConfig->eDetail;
        const u8 *pPos; int nPos;   /* Position list */
        i64 iPos = 0;               /* 64-bit position read from poslist */
        int iOff = 0;               /* Current offset within position list */

        pPos = pCsr->pIter->pData;
        nPos = pCsr->pIter->nData;

        switch( pTab->eType ){
          case FTS5_VOCAB_ROW:
            if( eDetail==FTS5_DETAIL_FULL ){
              while( 0==sqlite3Fts5PoslistNext64(pPos, nPos, &iOff, &iPos) ){
                pCsr->aCnt[0]++;
              }
            }
            pCsr->aDoc[0]++;
            break;

          case FTS5_VOCAB_COL:
            if( eDetail==FTS5_DETAIL_FULL ){
              int iCol = -1;
              while( 0==sqlite3Fts5PoslistNext64(pPos, nPos, &iOff, &iPos) ){
                int ii = FTS5_POS2COLUMN(iPos);
                if( iCol!=ii ){
                  if( ii>=nCol ){
                    rc = FTS5_CORRUPT;
                    break;
                  }
                  pCsr->aDoc[ii]++;
                  iCol = ii;
                }
                pCsr->aCnt[ii]++;
              }
            }else if( eDetail==FTS5_DETAIL_COLUMNS ){
              while( 0==sqlite3Fts5PoslistNext64(pPos, nPos, &iOff,&iPos) ){
                assert_nc( iPos>=0 && iPos<nCol );
                if( iPos>=nCol ){
                  rc = FTS5_CORRUPT;
                  break;
                }
                pCsr->aDoc[iPos]++;
              }
            }else{
              assert( eDetail==FTS5_DETAIL_NONE );
              pCsr->aDoc[0]++;
            }
            break;

          default:
            assert( pTab->eType==FTS5_VOCAB_INSTANCE );
            break;
        }

        if( rc==SQLITE_OK ){
          rc = sqlite3Fts5IterNextScan(pCsr->pIter);
        }
        if( pTab->eType==FTS5_VOCAB_INSTANCE ) break;

        if( rc==SQLITE_OK ){
          zTerm = sqlite3Fts5IterTerm(pCsr->pIter, &nTerm);
          if( nTerm!=pCsr->term.n 
          || (nTerm>0 && memcmp(zTerm, pCsr->term.p, nTerm)) 
          ){
            break;
          }
          if( sqlite3Fts5IterEof(pCsr->pIter) ) break;
        }
      }
    }
  }

  if( rc==SQLITE_OK && pCsr->bEof==0 && pTab->eType==FTS5_VOCAB_COL ){
    for(/* noop */; pCsr->iCol<nCol && pCsr->aDoc[pCsr->iCol]==0; pCsr->iCol++);
    if( pCsr->iCol==nCol ){
      rc = FTS5_CORRUPT;
    }
  }
  return rc;
}